

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O1

void __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::RBPath::fixup(RBPath *this,bool expected)

{
  uintptr_t *puVar1;
  long lVar2;
  undefined3 in_register_00000031;
  bool *pbVar3;
  
  if ((CONCAT31(in_register_00000031,expected) != 0) && (1 < this->length)) {
    lVar2 = this->length - 1;
    pbVar3 = &(this->path)._M_elems[1].dir;
    do {
      puVar1 = (uintptr_t *)
               ((**(ulong **)(pbVar3 + -0x18) & 0xfffffffffffffffe) + (ulong)(*pbVar3 ^ 1) * 8);
      if (puVar1 != (((RBStep *)(pbVar3 + -8))->node).ptr.val) {
        (((RBStep *)(pbVar3 + -8))->node).ptr.val = puVar1;
      }
      pbVar3 = pbVar3 + 0x10;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void fixup(bool expected = true)
      {
        if (!run_checks && !expected)
          return;

        // During a splice in remove the path can be invalidated,
        // this refreshs the path so that the it refers to the spliced
        // nodes fields.
        // TODO optimise usage to avoid traversing whole path.
        for (size_t i = 1; i < length; i++)
        {
          auto parent = path[i - 1].node;
          auto& curr = path[i].node;
          auto dir = path[i].dir;
          auto actual = get_dir(dir, parent);
          if (actual != curr)
          {
            if (!expected)
            {
              snmalloc::error("Performed an unexpected fixup.");
            }
            curr = actual;
          }
        }
      }